

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix.h
# Opt level: O0

void __thiscall
mp::BasicSuffixSet<std::allocator<char>_>::~BasicSuffixSet
          (BasicSuffixSet<std::allocator<char>_> *this)

{
  bool bVar1;
  pointer pIVar2;
  BasicSuffixSet<std::allocator<char>_> *this_00;
  allocator<char> *in_RDI;
  iterator e;
  iterator i;
  set<mp::internal::SuffixBase::Impl,_mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess,_std::allocator<mp::internal::SuffixBase::Impl>_>
  *in_stack_ffffffffffffffa8;
  _Rb_tree_const_iterator<mp::internal::SuffixBase::Impl> *in_stack_ffffffffffffffb0;
  double *in_stack_ffffffffffffffb8;
  BasicSuffixSet<std::allocator<char>_> *in_stack_ffffffffffffffc0;
  anon_union_8_3_3627ffa1_for_Impl_3 in_stack_ffffffffffffffc8;
  _Self local_18;
  iterator local_10;
  
  *(undefined ***)in_RDI = &PTR__BasicSuffixSet_0023d2b0;
  local_10 = std::
             set<mp::internal::SuffixBase::Impl,_mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess,_std::allocator<mp::internal::SuffixBase::Impl>_>
             ::begin(in_stack_ffffffffffffffa8);
  local_18._M_node =
       (_Base_ptr)
       std::
       set<mp::internal::SuffixBase::Impl,_mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess,_std::allocator<mp::internal::SuffixBase::Impl>_>
       ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = std::operator!=(&stack0xfffffffffffffff0,&local_18);
    if (!bVar1) break;
    pIVar2 = std::_Rb_tree_const_iterator<mp::internal::SuffixBase::Impl>::operator->
                       (in_stack_ffffffffffffffb0);
    fmt::BasicStringRef<char>::data(&pIVar2->name);
    pIVar2 = std::_Rb_tree_const_iterator<mp::internal::SuffixBase::Impl>::operator->
                       (in_stack_ffffffffffffffb0);
    this_00 = (BasicSuffixSet<std::allocator<char>_> *)
              fmt::BasicStringRef<char>::size(&pIVar2->name);
    Deallocate<char>(this_00,(char *)in_stack_ffffffffffffffc8.int_values,
                     (size_t)in_stack_ffffffffffffffc0);
    pIVar2 = std::_Rb_tree_const_iterator<mp::internal::SuffixBase::Impl>::operator->
                       (in_stack_ffffffffffffffb0);
    if ((pIVar2->kind & 4U) == 0) {
      in_stack_ffffffffffffffb0 = &stack0xfffffffffffffff0;
      pIVar2 = std::_Rb_tree_const_iterator<mp::internal::SuffixBase::Impl>::operator->
                         (in_stack_ffffffffffffffb0);
      in_stack_ffffffffffffffb8 = (double *)(pIVar2->field_3).int_values;
      std::_Rb_tree_const_iterator<mp::internal::SuffixBase::Impl>::operator->
                (in_stack_ffffffffffffffb0);
      Deallocate<int>(in_stack_ffffffffffffffc0,(int *)in_stack_ffffffffffffffb8,
                      (size_t)in_stack_ffffffffffffffb0);
    }
    else {
      in_stack_ffffffffffffffc0 = (BasicSuffixSet<std::allocator<char>_> *)&stack0xfffffffffffffff0;
      pIVar2 = std::_Rb_tree_const_iterator<mp::internal::SuffixBase::Impl>::operator->
                         (in_stack_ffffffffffffffb0);
      in_stack_ffffffffffffffc8 = pIVar2->field_3;
      std::_Rb_tree_const_iterator<mp::internal::SuffixBase::Impl>::operator->
                (in_stack_ffffffffffffffb0);
      Deallocate<double>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         (size_t)in_stack_ffffffffffffffb0);
    }
    std::_Rb_tree_const_iterator<mp::internal::SuffixBase::Impl>::operator++
              (in_stack_ffffffffffffffb0);
  }
  std::
  set<mp::internal::SuffixBase::Impl,_mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess,_std::allocator<mp::internal::SuffixBase::Impl>_>
  ::~set((set<mp::internal::SuffixBase::Impl,_mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess,_std::allocator<mp::internal::SuffixBase::Impl>_>
          *)0x12ab3b);
  std::allocator<char>::~allocator(in_RDI);
  return;
}

Assistant:

BasicSuffixSet<Alloc>::~BasicSuffixSet() {
  /// Deallocate names and values.
  for (typename Set::iterator i = set_.begin(), e = set_.end(); i != e; ++i) {
    Deallocate(const_cast<char*>(i->name.data()), i->name.size()+1);
    if ((i->kind & suf::FLOAT) != 0)
      Deallocate(i->dbl_values, i->num_values);
    else
      Deallocate(i->int_values, i->num_values);
  }
}